

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CETime.cpp
# Opt level: O0

double CETime::TimeSec2Time(double *seconds)

{
  double *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double hrs;
  double min;
  double sec;
  double fracsec;
  double secs;
  undefined8 local_10;
  
  for (local_10 = *in_RDI; local_10 < 0.0; local_10 = dVar1 + local_10) {
    dVar1 = CppEphem::sec_per_day();
  }
  dVar1 = floor(local_10);
  dVar2 = floor(local_10);
  dVar2 = (double)((int)dVar2 % 0x3c);
  dVar3 = floor(local_10 - dVar2);
  dVar4 = floor(local_10 - dVar2);
  return (double)((int)(dVar4 / 60.0) / 0x3c) * 10000.0 +
         (double)((int)(dVar3 / 60.0) % 0x3c) * 100.0 + dVar2 + (local_10 - dVar1);
}

Assistant:

double CETime::TimeSec2Time(const double& seconds)
{
    // Make sure the seconds are positive
    double secs(seconds);
    while (secs < 0.0) {
        secs += CppEphem::sec_per_day();
    }

    // Now do the actual conversion to a vector
    double fracsec = secs - std::floor(secs) ;          // Fractions of a second
    double sec = int(std::floor(secs)) % 60 ;           // Whole seconds
    double min = int(std::floor(secs-sec)/60) % 60 ;    // Whole minutes
    double hrs = int(std::floor(secs-sec)/60)/60 ;      // Whole hours
    return (hrs*10000) + (min*100) + sec + fracsec ;    // Formatted double (HHMMSS.S)
}